

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getAutoVacuum(char *z)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int x;
  undefined8 uStack_18;
  
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = "unix-none"[lVar3 + 5];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return 0;
  }
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = "database or disk is full"[lVar3 + 0x14];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return 1;
  }
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = "incremental"[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_0019c24e;
    }
    else if (""[bVar1] != ""[bVar2]) {
LAB_0019c24e:
      if (bVar1 == bVar2) {
        return 2;
      }
      uStack_18 = 2;
      sqlite3GetInt32(z,(int *)((long)&uStack_18 + 4));
      if (uStack_18._4_4_ < 3) {
        return uStack_18._4_4_ & 0xff;
      }
      return 0;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}